

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O3

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::equalsn
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this,unsigned_short *str1,
          unsigned_short *str2,int len)

{
  unsigned_short uVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  uVar1 = *str1;
  if (uVar1 == 0) {
    iVar2 = 0;
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      if ((len <= lVar3) || (str2[lVar3] == 0)) {
        return len == (int)lVar3;
      }
      if (uVar1 != str2[lVar3]) {
        return false;
      }
      uVar1 = str1[lVar3 + 1];
      lVar3 = lVar3 + 1;
    } while (uVar1 != 0);
    iVar2 = (int)lVar3;
  }
  bVar4 = true;
  if (iVar2 != len) {
    bVar4 = str2[lVar3] == 0;
  }
  return bVar4;
}

Assistant:

bool equalsn(const char_type* str1, const char_type* str2, int len)
	{
		int i;
		for(i=0; str1[i] && str2[i] && i < len; ++i)
			if (str1[i] != str2[i])
				return false;

		// if one (or both) of the strings was smaller then they
		// are only equal if they have the same lenght
		return (i == len) || (str1[i] == 0 && str2[i] == 0);
	}